

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fctkern__log_warn(fctkern_t *nk,char *warn)

{
  size_t sVar1;
  void *pvVar2;
  size_t idx;
  
  if (nk == (fctkern_t *)0x0) {
    __assert_fail("nk != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x959
                  ,"void fctkern__log_warn(fctkern_t *, const char *)");
  }
  if (warn != (char *)0x0) {
    sVar1 = (nk->logger_list).used_itm_num;
    for (idx = 0; sVar1 != idx; idx = idx + 1) {
      pvVar2 = fct_nlist__at(&nk->logger_list,idx);
      *(char **)((long)pvVar2 + 0x78) = warn;
      (**(code **)((long)pvVar2 + 0x40))(pvVar2,(long)pvVar2 + 0x58);
    }
    return;
  }
  __assert_fail("warn != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x95a,
                "void fctkern__log_warn(fctkern_t *, const char *)");
}

Assistant:

static void
fctkern__log_warn(fctkern_t *nk, char const *warn)
{
    FCT_ASSERT( nk != NULL );
    FCT_ASSERT( warn != NULL );
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_warn(logger, warn);
    }
    FCT_NLIST_FOREACH_END();
}